

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall ncnn::Padding::load_model(Padding *this,ModelBin *mb)

{
  long *in_RSI;
  Mat *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Mat *in_stack_ffffffffffffff98;
  undefined1 local_58 [88];
  
  if (in_RDI[3].elempack != 0) {
    (**(code **)(*in_RSI + 0x10))(local_58,in_RSI,in_RDI[3].elempack,1,in_R8,in_R9,local_58);
    ncnn::Mat::operator=(in_stack_ffffffffffffff98,in_RDI);
    ncnn::Mat::~Mat((Mat *)0x692939);
  }
  return 0;
}

Assistant:

int Padding::load_model(const ModelBin& mb)
{
    if (per_channel_pad_data_size)
    {
        per_channel_pad_data = mb.load(per_channel_pad_data_size, 1);
    }

    return 0;
}